

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall
t_swift_generator::render_const_value
          (t_swift_generator *this,ostream *out,t_type *type,t_const_value *value)

{
  uint uVar1;
  pointer pcVar2;
  t_field *tfield;
  long lVar3;
  size_t __n;
  undefined1 *puVar4;
  t_type *type_00;
  string *psVar5;
  _Alloc_hider _Var6;
  int iVar7;
  t_const_value_type tVar8;
  t_type *ptVar9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  int64_t iVar12;
  _Rb_tree_node_base *p_Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined4 extraout_var;
  long *plVar15;
  undefined4 extraout_var_00;
  size_type *psVar16;
  ulong uVar17;
  _func_int **pp_Var18;
  t_swift_generator *ptVar19;
  char *pcVar20;
  t_const_value *value_00;
  _Rb_tree_header *p_Var21;
  bool bVar22;
  undefined1 auVar23 [12];
  string local_d8;
  t_type *local_b8;
  t_swift_generator *local_b0;
  ostream *local_a8;
  t_const_value *local_a0;
  _func_int **local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ptVar9 = t_type::get_true_type(type);
  iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[5])(ptVar9);
  if ((char)iVar7 == '\0') {
    iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[10])(ptVar9);
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xb])(ptVar9);
      if (((char)iVar7 != '\0') ||
         (iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])(ptVar9), (char)iVar7 != '\0')) {
        type_name_abi_cxx11_(&local_d8,this,ptVar9,false,false);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (out,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
        local_b0 = this;
        local_a0 = value;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        pp_Var18 = ptVar9[1].super_t_doc._vptr_t_doc;
        if (pp_Var18 != (_func_int **)ptVar9[1].super_t_doc.doc_._M_dataplus._M_p) {
          p_Var21 = &(local_a0->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          local_b8 = ptVar9;
          local_a8 = out;
          do {
            tfield = (t_field *)*pp_Var18;
            p_Var11 = (local_a0->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_98 = pp_Var18;
            if ((_Rb_tree_header *)p_Var11 == p_Var21) {
LAB_00354a89:
              bVar22 = field_is_optional(local_b0,tfield);
              out = local_a8;
              if (!bVar22) {
                pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __cxa_allocate_exception(0x20);
                iVar7 = (*(local_b8->super_t_doc)._vptr_t_doc[3])();
                std::operator+(&local_70,"constant error: required field ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(extraout_var,iVar7));
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_70);
                local_90._M_dataplus._M_p = (pointer)*plVar15;
                psVar16 = (size_type *)(plVar15 + 2);
                if ((size_type *)local_90._M_dataplus._M_p == psVar16) {
                  local_90.field_2._M_allocated_capacity = *psVar16;
                  local_90.field_2._8_8_ = plVar15[3];
                  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                }
                else {
                  local_90.field_2._M_allocated_capacity = *psVar16;
                }
                local_90._M_string_length = plVar15[1];
                *plVar15 = (long)psVar16;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                std::operator+(&local_d8,&local_90,&tfield->name_);
                std::operator+(pbVar14,&local_d8," has no value");
                __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
            }
            else {
              value_00 = (t_const_value *)0x0;
              do {
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                lVar3 = *(long *)(*(long *)(p_Var11 + 1) + 0x48);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,lVar3,
                           *(long *)(*(long *)(p_Var11 + 1) + 0x50) + lVar3);
                _Var6._M_p = local_d8._M_dataplus._M_p;
                __n = (tfield->name_)._M_string_length;
                if (__n == local_d8._M_string_length) {
                  if (__n == 0) {
                    bVar22 = true;
                  }
                  else {
                    iVar7 = bcmp((tfield->name_)._M_dataplus._M_p,local_d8._M_dataplus._M_p,__n);
                    bVar22 = iVar7 == 0;
                  }
                }
                else {
                  bVar22 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var6._M_p != &local_d8.field_2) {
                  operator_delete(_Var6._M_p);
                }
                if (bVar22) {
                  value_00 = (t_const_value *)p_Var11[1]._M_parent;
                }
                p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
                out = local_a8;
              } while ((_Rb_tree_header *)p_Var11 != p_Var21);
              if (value_00 == (t_const_value *)0x0) goto LAB_00354a89;
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (local_a8,(tfield->name_)._M_dataplus._M_p,
                                   (tfield->name_)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
              render_const_value(local_b0,out,tfield->type_,value_00);
            }
            ptVar9 = local_b8;
            pp_Var18 = local_98 + 1;
          } while ((pp_Var18 != (_func_int **)local_b8[1].super_t_doc.doc_._M_dataplus._M_p) &&
                  (std::__ostream_insert<char,std::char_traits<char>>(out,", ",2),
                  pp_Var18 != (_func_int **)ptVar9[1].super_t_doc.doc_._M_dataplus._M_p));
        }
        goto LAB_00354ddb;
      }
      iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0x10])(ptVar9);
      if ((char)iVar7 == '\0') {
        iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xe])(ptVar9);
        if ((char)iVar7 == '\0') {
          iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xf])(ptVar9);
          if ((char)iVar7 == '\0') {
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])(ptVar9);
            std::operator+(pbVar14,"compiler error: no const of type ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar7));
            __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
          p_Var13 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var21 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var13 != p_Var21) {
            ptVar9 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
            render_const_value(this,out,ptVar9,*(t_const_value **)(p_Var13 + 1));
            for (p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
                (_Rb_tree_header *)p_Var13 != p_Var21;
                p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
              render_const_value(this,out,ptVar9,*(t_const_value **)(p_Var13 + 1));
            }
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
          p_Var13 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var21 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var13 != p_Var21) {
            ptVar9 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
            render_const_value(this,out,ptVar9,*(t_const_value **)(p_Var13 + 1));
            for (p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
                (_Rb_tree_header *)p_Var13 != p_Var21;
                p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
              render_const_value(this,out,ptVar9,*(t_const_value **)(p_Var13 + 1));
            }
          }
        }
        pcVar20 = "]";
        uVar17 = 1;
      }
      else {
        local_b8 = ptVar9;
        local_b0 = this;
        std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
        ptVar19 = local_b0;
        p_Var11 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var21 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var11 != p_Var21) {
          ptVar9 = *(t_type **)&local_b8[1].super_t_doc.has_doc_;
          type_00 = *(t_type **)&local_b8[1].annotations_._M_t._M_impl;
          while( true ) {
            render_const_value(ptVar19,out,ptVar9,*(t_const_value **)(p_Var11 + 1));
            std::__ostream_insert<char,std::char_traits<char>>(out,": ",2);
            render_const_value(ptVar19,out,type_00,(t_const_value *)p_Var11[1]._M_parent);
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
            if ((_Rb_tree_header *)p_Var11 == p_Var21) break;
            std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
          }
        }
        pcVar20 = "]";
        uVar17 = 1;
      }
      goto LAB_00354ea5;
    }
    bVar22 = this->gen_cocoa_;
    if (bVar22 == true) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      pcVar2 = (value->identifierVal_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar2,pcVar2 + (value->identifierVal_)._M_string_length);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ptVar19 = (t_swift_generator *)(value->identifierVal_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,ptVar19,
                 (pointer)((long)&(ptVar19->super_t_oop_generator).super_t_generator.
                                  _vptr_t_generator + (value->identifierVal_)._M_string_length));
      enum_const_name(&local_d8,ptVar19,&local_50);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (bVar22 != false) {
      return;
    }
    psVar5 = &local_50;
  }
  else {
    uVar1 = *(uint *)&ptVar9[1].super_t_doc._vptr_t_doc;
    switch(uVar1) {
    case 1:
      std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
      t_generator::get_escaped_string_abi_cxx11_(&local_d8,(t_generator *)this,value);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
      break;
    case 2:
      iVar12 = t_const_value::get_integer(value);
      pcVar20 = "false";
      if (0 < iVar12) {
        pcVar20 = "true";
      }
      uVar17 = (ulong)(0 < iVar12) ^ 5;
LAB_00354ea5:
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar20,uVar17);
      return;
    case 3:
    case 4:
    case 5:
    case 6:
      type_name_abi_cxx11_(&local_d8,this,ptVar9,false,false);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
      t_const_value::get_integer(value);
      poVar10 = std::ostream::_M_insert<long>((long)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
      break;
    case 7:
      type_name_abi_cxx11_(&local_d8,this,ptVar9,false,false);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      tVar8 = t_const_value::get_type(value);
      if (tVar8 == CV_INTEGER) {
        t_const_value::get_integer(value);
        std::ostream::_M_insert<long>((long)out);
      }
      else {
        std::ostream::_M_insert<double>(value->doubleVal_);
      }
LAB_00354ddb:
      std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
      return;
    default:
      auVar23 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_d8,(t_base_type *)(ulong)uVar1,auVar23._8_4_);
      std::operator+(auVar23._0_8_,"compiler error: no const of base type ",&local_d8);
      __cxa_throw(auVar23._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    psVar5 = &local_d8;
  }
  puVar4 = *(undefined1 **)((psVar5->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 != &psVar5->field_2) {
    operator_delete(puVar4);
  }
  return;
}

Assistant:

void t_swift_generator::render_const_value(ostream& out,
                                           t_type* type,
                                           t_const_value* value) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << "\"" << get_escaped_string(value) << "\"";
      break;
    case t_base_type::TYPE_BOOL:
      out << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << type_name(type) << "(" << value->get_integer() << ")";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << type_name(type) << "(";
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      out << ")";
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << (gen_cocoa_ ? value->get_identifier() : enum_const_name(value->get_identifier())); // Swift2/Cocoa compatibility
  } else if (type->is_struct() || type->is_xception()) {

    out << type_name(type) << "(";

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field* tfield = *f_iter;
      t_const_value* value = nullptr;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        if (tfield->get_name() == v_iter->first->get_string()) {
          value = v_iter->second;
        }
      }

      if (value) {
        out << tfield->get_name() << ": ";
        render_const_value(out, tfield->get_type(), value);
      }
      else if (!field_is_optional(tfield)) {
        throw "constant error: required field " + type->get_name() + "." + tfield->get_name() + " has no value";
      }

      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }

    out << ")";

  } else if (type->is_map()) {

    out << "[";

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, ktype, v_iter->first);
      out << ": ";
      render_const_value(out, vtype, v_iter->second);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else if (type->is_list()) {

    out << "[";

    t_type* etype = ((t_list*)type)->get_elem_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, etype, v_iter->first);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else if (type->is_set()) {

    out << "[";

    t_type* etype = ((t_set*)type)->get_elem_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, etype, v_iter->first);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else {
    throw "compiler error: no const of type " + type->get_name();
  }

}